

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_shar.c
# Opt level: O0

ssize_t archive_write_shar_data_sed(archive_write *a,void *buff,size_t n)

{
  char cVar1;
  void *pvVar2;
  long lVar3;
  int iVar4;
  archive_string *paVar5;
  char *pcVar6;
  shar *psVar7;
  char *pcVar8;
  size_t written;
  int ret;
  char *buf_end;
  char *buf;
  char *src;
  shar *shar;
  size_t n_local;
  void *buff_local;
  archive_write *a_local;
  
  pvVar2 = a->format_data;
  if ((*(int *)((long)pvVar2 + 0x10) == 0) || (n == 0)) {
    a_local = (archive_write *)0x0;
  }
  else {
    paVar5 = archive_string_ensure((archive_string *)((long)pvVar2 + 0x60),0x10000);
    if (paVar5 == (archive_string *)0x0) {
      archive_set_error(&a->archive,0xc,"Out of memory");
      a_local = (archive_write *)0xffffffffffffffe2;
    }
    else {
      if (0xfffd < *(ulong *)((long)pvVar2 + 0x68)) {
        iVar4 = __archive_write_output
                          (a,*(void **)((long)pvVar2 + 0x60),*(size_t *)((long)pvVar2 + 0x68));
        if (iVar4 != 0) {
          return -0x1e;
        }
        *(undefined8 *)((long)pvVar2 + 0x68) = 0;
      }
      pcVar6 = (char *)(*(long *)((long)pvVar2 + 0x60) + *(long *)((long)pvVar2 + 0x68));
      lVar3 = *(long *)((long)pvVar2 + 0x60);
      buf_end = pcVar6;
      buf = (char *)buff;
      shar = (shar *)n;
      if (*(int *)((long)pvVar2 + 4) != 0) {
        buf_end = pcVar6 + 1;
        *pcVar6 = 'X';
        *(undefined4 *)((long)pvVar2 + 4) = 0;
        buf = (char *)buff;
        shar = (shar *)n;
      }
      while (psVar7 = (shar *)((long)&shar[-1].quoted_name.buffer_length + 7), shar != (shar *)0x0)
      {
        pcVar8 = buf + 1;
        cVar1 = *buf;
        pcVar6 = buf_end + 1;
        *buf_end = cVar1;
        if (cVar1 == '\n') {
          if (psVar7 == (shar *)0x0) {
            *(undefined4 *)((long)pvVar2 + 4) = 1;
          }
          else {
            *pcVar6 = 'X';
            pcVar6 = buf_end + 2;
          }
        }
        buf_end = pcVar6;
        buf = pcVar8;
        shar = psVar7;
        if ((char *)(lVar3 + 0xfffdU) <= buf_end) {
          *(long *)((long)pvVar2 + 0x68) = (long)buf_end - *(long *)((long)pvVar2 + 0x60);
          iVar4 = __archive_write_output
                            (a,*(void **)((long)pvVar2 + 0x60),*(size_t *)((long)pvVar2 + 0x68));
          if (iVar4 != 0) {
            return -0x1e;
          }
          *(undefined8 *)((long)pvVar2 + 0x68) = 0;
          buf_end = *(char **)((long)pvVar2 + 0x60);
        }
      }
      *(long *)((long)pvVar2 + 0x68) = (long)buf_end - *(long *)((long)pvVar2 + 0x60);
      a_local = (archive_write *)n;
    }
  }
  return (ssize_t)a_local;
}

Assistant:

static ssize_t
archive_write_shar_data_sed(struct archive_write *a, const void *buff, size_t n)
{
	static const size_t ensured = 65533;
	struct shar *shar;
	const char *src;
	char *buf, *buf_end;
	int ret;
	size_t written = n;

	shar = (struct shar *)a->format_data;
	if (!shar->has_data || n == 0)
		return (0);

	src = (const char *)buff;

	/*
	 * ensure is the number of bytes in buffer before expanding the
	 * current character.  Each operation writes the current character
	 * and optionally the start-of-new-line marker.  This can happen
	 * twice before entering the loop, so make sure three additional
	 * bytes can be written.
	 */
	if (archive_string_ensure(&shar->work, ensured + 3) == NULL) {
		archive_set_error(&a->archive, ENOMEM, "Out of memory");
		return (ARCHIVE_FATAL);
	}

	if (shar->work.length > ensured) {
		ret = __archive_write_output(a, shar->work.s,
		    shar->work.length);
		if (ret != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		archive_string_empty(&shar->work);
	}
	buf = shar->work.s + shar->work.length;
	buf_end = shar->work.s + ensured;

	if (shar->end_of_line) {
		*buf++ = 'X';
		shar->end_of_line = 0;
	}

	while (n-- != 0) {
		if ((*buf++ = *src++) == '\n') {
			if (n == 0)
				shar->end_of_line = 1;
			else
				*buf++ = 'X';
		}

		if (buf >= buf_end) {
			shar->work.length = buf - shar->work.s;
			ret = __archive_write_output(a, shar->work.s,
			    shar->work.length);
			if (ret != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			archive_string_empty(&shar->work);
			buf = shar->work.s;
		}
	}

	shar->work.length = buf - shar->work.s;

	return (written);
}